

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_35bf99::PpuTest_visible_two_sub_cycles_Test::TestBody
          (PpuTest_visible_two_sub_cycles_Test *this)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  IPpu *pIVar1;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar2;
  uint extraout_var;
  char *message;
  char *in_R9;
  int iVar3;
  ReturnAction<int> local_b0;
  InSequence seq;
  MatcherBase<unsigned_short> local_98;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  
  (this->super_PpuTest).expected.scanline = 0;
  (this->super_PpuTest).expected.cycle = 0x11;
  (this->super_PpuTest).registers.scanline = 0;
  (this->super_PpuTest).expected.mask.super_Register<unsigned_char>.value_ = '\x1e';
  (this->super_PpuTest).registers.mask.super_Register<unsigned_char>.value_ = '\x1e';
  (this->super_PpuTest).expected.vram_addr.super_Register<unsigned_short>.value_ = 2;
  (this->super_PpuTest).expected.name_table_latch = '\x03';
  (this->super_PpuTest).expected.name_table = '\x02';
  (this->super_PpuTest).expected.pattern_table_shifter_hi = 0x4c80;
  (this->super_PpuTest).expected.pattern_table_latch_low = 0x80;
  (this->super_PpuTest).expected.pattern_table_latch_hi = 0x99;
  (this->super_PpuTest).expected.pattern_table_shifter_low = 0x4000;
  (this->super_PpuTest).expected.attribute_table_shifter_low = 0x7f80;
  (this->super_PpuTest).expected.attribute_table_shifter_hi = 0x7f80;
  (this->super_PpuTest).expected.attribute_table_latch = '\x03';
  pIVar1 = (this->super_PpuTest).ppu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
           super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl;
  (*pIVar1->_vptr_IPpu[3])(pIVar1,0x2005,0);
  pIVar1 = (this->super_PpuTest).ppu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
           super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl;
  (*pIVar1->_vptr_IPpu[3])(pIVar1,0x2005,0);
  testing::InSequence::InSequence(&seq);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_98,0x2000);
  this_00 = &(this->super_PpuTest).mmu;
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_98);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x294,"mmu","read_byte(0x2000)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_b0,2);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar_,(ReturnAction *)&local_b0);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_98);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_98,0x23c0);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_98);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x298,"mmu","read_byte(0x23C0)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_b0,0xab);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar_,(ReturnAction *)&local_b0);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_98);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_98,0x20);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_98);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x29c,"mmu","read_byte(0x02 * 16u)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_b0,0x80);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar_,(ReturnAction *)&local_b0);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_98);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_98,0x28);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_98);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x29f,"mmu","read_byte(0x02 * 16u + 8u)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_b0,0x99);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar_,(ReturnAction *)&local_b0);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_98);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_98,0x2001);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_98);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x2a2,"mmu","read_byte(0x2001)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_b0,3);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar_,(ReturnAction *)&local_b0);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_98);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_98,0x23c0);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_98);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x2a6,"mmu","read_byte(0x23C0)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_b0,0xab);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar_,(ReturnAction *)&local_b0);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_98);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_98,0x30);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_98);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x2a9,"mmu","read_byte(0x03 * 16u)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_b0,0x80);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar_,(ReturnAction *)&local_b0);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_98);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_98,0x38);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_98);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x2ab,"mmu","read_byte(0x03 * 16u + 8u)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_b0,0x99);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar_,(ReturnAction *)&local_b0);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_98);
  testing::InSequence::~InSequence(&seq);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_98,0x3f00);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_98);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x2af,"mmu","read_byte(0x3F00)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_b0,0);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar_,(ReturnAction *)&local_b0);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_98);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_98,0x3f01);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_98);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x2b0,"mmu","read_byte(0x3F01)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_b0,1);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar_,(ReturnAction *)&local_b0);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_98);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_98,0x3f02);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_98);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x2b1,"mmu","read_byte(0x3F02)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_b0,2);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar_,(ReturnAction *)&local_b0);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_98);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_98,0x3f03);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_98);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x2b2,"mmu","read_byte(0x3F03)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_b0,3);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar_,(ReturnAction *)&local_b0);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_98);
  iVar3 = 0x11;
  do {
    if (iVar3 == 0) {
      testing::internal::CmpHelperEQ<n_e_s::core::PpuRegisters,n_e_s::core::PpuRegisters>
                ((internal *)&gtest_ar,"expected","registers",&(this->super_PpuTest).expected,
                 &(this->super_PpuTest).registers);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = "";
        }
        else {
          message = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                   ,0x2bd,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
        if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      return;
    }
    (*((this->super_PpuTest).ppu._M_t.
       super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
       super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
       super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl)->_vptr_IPpu[4])();
    if (iVar3 == 0x11) {
      gtest_ar_.success_ = (bool)(~(byte)(extraout_var >> 8) & 1);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_98);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"pixel.has_value()"
                   ,"true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                   ,0x2b7,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
LAB_0019df10:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (local_98.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
            (_func_int **)0x0) {
          (**(code **)(*local_98.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8
                      ))();
        }
      }
    }
    else {
      gtest_ar_.success_ = (bool)((byte)(((ulong)extraout_var & 0xff00) >> 8) & 1);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (((((ulong)extraout_var & 0xff00) << 0x20) >> 0x28 & 1) == 0) {
        testing::Message::Message((Message *)&local_98);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"pixel.has_value()"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                   ,0x2b9,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
        goto LAB_0019df10;
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar3 = iVar3 + -1;
  } while( true );
}

Assistant:

TEST_F(PpuTest, visible_two_sub_cycles) {
    registers.scanline = expected.scanline = 0;
    registers.mask = expected.mask =
            PpuMask(0x1E); // Enable background rendering

    expected.cycle = 17;
    // Vram should be increased at cycle 8 and 16
    expected.vram_addr = PpuVram(0x0002);
    expected.name_table = 0x02;
    expected.name_table_latch = 0x03;
    expected.pattern_table_shifter_hi = 0x4C80;
    expected.pattern_table_latch_hi = 0x99;
    expected.pattern_table_shifter_low = 0x4000;
    expected.pattern_table_latch_low = 0x80;
    expected.attribute_table_shifter_low = 0x7F80;
    expected.attribute_table_shifter_hi = 0x7F80;
    expected.attribute_table_latch = 0x03;

    // Clear scrolling
    ppu->write_byte(0x2005, 0);
    ppu->write_byte(0x2005, 0);

    {
        testing::InSequence seq;
        // Nametable on cycle 1 set to index 2
        EXPECT_CALL(mmu, read_byte(0x2000)).WillOnce(Return(0x02));

        // Attribute on cycle 3.
        // Second tile has the same attribute byte as the first.
        EXPECT_CALL(mmu, read_byte(0x23C0)).WillRepeatedly(Return(0xAB));

        // Pattern table low byte on cycle 5.
        // Each tile uses 16 bytes. So tile with index 2 starts at address 16*2.
        EXPECT_CALL(mmu, read_byte(0x02 * 16u)).WillOnce(Return(0x80));
        // High byte on cycle 7
        // Second bit plane address is 8 bytes after the first bit plane.
        EXPECT_CALL(mmu, read_byte(0x02 * 16u + 8u)).WillOnce(Return(0x99));

        // Nametable on cycle 9 set to index 3
        EXPECT_CALL(mmu, read_byte(0x2001)).WillOnce(Return(0x03));

        // Attribute on cycle 11.
        // Second tile has the same attribute byte as the first.
        EXPECT_CALL(mmu, read_byte(0x23C0)).WillRepeatedly(Return(0xAB));

        // Pattern table low byte on cycle 13.
        EXPECT_CALL(mmu, read_byte(0x03 * 16u)).WillOnce(Return(0x80));
        // Pattern table high byte on cycle 15
        EXPECT_CALL(mmu, read_byte(0x03 * 16u + 8u)).WillOnce(Return(0x99));
    }

    // Palette index
    EXPECT_CALL(mmu, read_byte(0x3F00)).WillRepeatedly(Return(0x00));
    EXPECT_CALL(mmu, read_byte(0x3F01)).WillRepeatedly(Return(0x01));
    EXPECT_CALL(mmu, read_byte(0x3F02)).WillRepeatedly(Return(0x02));
    EXPECT_CALL(mmu, read_byte(0x3F03)).WillRepeatedly(Return(0x03));

    for (int i = 0; i < 17; ++i) {
        const auto pixel = ppu->execute();
        if (i == 0) {
            EXPECT_FALSE(pixel.has_value());
        } else {
            EXPECT_TRUE(pixel.has_value());
        }
    }

    EXPECT_EQ(expected, registers);
}